

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QSize __thiscall QCss::ValueExtractor::sizeValue(ValueExtractor *this,Declaration *decl)

{
  DeclarationData *pDVar1;
  Representation RVar2;
  Representation RVar3;
  QSize QVar4;
  ValueExtractor *this_00;
  QArrayDataPointer<QVariant> *this_01;
  long in_FS_OFFSET;
  LengthData LVar5;
  QArrayDataPointer<QVariant> local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [24];
  QVariant *pQStack_40;
  long local_38;
  
  this_01 = &local_b8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (decl->d).d.ptr;
  if (3 < *(ulong *)&(pDVar1->parsed).d.field_0x18) {
    this_01 = (QArrayDataPointer<QVariant> *)local_58;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    LVar5 = qvariant_cast<QCss::LengthData>((QVariant *)local_58._8_8_);
    local_78.shared = (PrivateShared *)LVar5.number;
    local_78._8_4_ = LVar5.unit;
    RVar2.m_i = lengthValueFromData((LengthData *)&local_78,&this->f);
    LVar5 = qvariant_cast<QCss::LengthData>((QVariant *)(local_58._8_8_ + 0x20));
    local_98.shared = (PrivateShared *)LVar5.number;
    local_98._8_4_ = LVar5.unit;
    RVar3.m_i = lengthValueFromData((LengthData *)&local_98,&this->f);
    goto LAB_0053f45a;
  }
  local_58._16_8_ = 0;
  pQStack_40 = (QVariant *)0x0;
  local_58._0_8_ = (Data *)0x0;
  local_58._8_8_ = (QVariant *)0x0;
  if ((pDVar1->values).d.size == 0) {
LAB_0053f39a:
    local_58._16_8_ = local_58._0_8_;
    pQStack_40 = (QVariant *)local_58._8_8_;
  }
  else {
    this_00 = this;
    LVar5 = lengthValue(this,(pDVar1->values).d.ptr);
    local_58._0_8_ = LVar5.number;
    local_58._8_4_ = LVar5.unit;
    pDVar1 = (decl->d).d.ptr;
    if ((ulong)(pDVar1->values).d.size < 2) goto LAB_0053f39a;
    LVar5 = lengthValue(this_00,(pDVar1->values).d.ptr + 1);
    local_58._16_8_ = LVar5.number;
    pQStack_40 = (QVariant *)CONCAT44(pQStack_40._4_4_,LVar5.unit);
  }
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QVariant *)0x0;
  local_b8.size = 0;
  ::QVariant::fromValue<QCss::LengthData>
            ((enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
              *)&local_78,(LengthData *)local_58);
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_b8,(QVariant *)&local_78);
  ::QVariant::fromValue<QCss::LengthData>
            ((enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
              *)&local_98,(LengthData *)(local_58 + 0x10));
  QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_b8,(QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_78);
  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict1 *)&local_b8);
  ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  RVar2.m_i = lengthValueFromData((LengthData *)local_58,&this->f);
  RVar3.m_i = lengthValueFromData((LengthData *)(local_58 + 0x10),&this->f);
LAB_0053f45a:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar4.ht.m_i = RVar3.m_i;
    QVar4.wd.m_i = RVar2.m_i;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize ValueExtractor::sizeValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        return QSize(lengthValueFromData(qvariant_cast<LengthData>(v.at(0)), f),
                     lengthValueFromData(qvariant_cast<LengthData>(v.at(1)), f));
    }

    LengthData x[2] = { {0, LengthData::None }, {0, LengthData::None} };
    if (decl.d->values.size() > 0)
        x[0] = lengthValue(decl.d->values.at(0));
    if (decl.d->values.size() > 1)
        x[1] = lengthValue(decl.d->values.at(1));
    else
        x[1] = x[0];
    QList<QVariant> v;
    v << QVariant::fromValue<LengthData>(x[0]) << QVariant::fromValue<LengthData>(x[1]);
    decl.d->parsed = v;
    return QSize(lengthValueFromData(x[0], f), lengthValueFromData(x[1], f));
}